

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O1

void embree::avx::
     BVHNIntersector1<4,_16777232,_false,_embree::avx::ArrayIntersector1<embree::avx::InstanceIntersector1MB>_>
     ::occluded(Intersectors *This,Ray *ray,RayQueryContext *context)

{
  float *pfVar1;
  float *pfVar2;
  float fVar3;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  bool bVar7;
  AABBNodeMB4D *node1;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  ulong uVar11;
  NodeRef *pNVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  size_t sVar16;
  InstancePrimitive *prim;
  int iVar17;
  undefined4 uVar18;
  ulong unaff_R14;
  size_t mask;
  bool bVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  float fVar34;
  float fVar38;
  float fVar39;
  undefined1 auVar35 [16];
  float fVar40;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  Precalculations pre;
  NodeRef stack [244];
  
  if (*(long *)&This->ptr[1].bounds.bounds0.lower.field_0 != 8) {
    fVar3 = ray->tfar;
    if (0.0 <= fVar3) {
      pNVar12 = stack + 1;
      stack[0].ptr = *(size_t *)&This->ptr[1].bounds.bounds0.lower.field_0;
      aVar4 = (ray->dir).field_0;
      auVar5 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->org).field_0.m128[3]));
      auVar35._8_4_ = 0x7fffffff;
      auVar35._0_8_ = 0x7fffffff7fffffff;
      auVar35._12_4_ = 0x7fffffff;
      auVar35 = vandps_avx((undefined1  [16])aVar4,auVar35);
      auVar21._8_4_ = 0x219392ef;
      auVar21._0_8_ = 0x219392ef219392ef;
      auVar21._12_4_ = 0x219392ef;
      auVar35 = vcmpps_avx(auVar35,auVar21,1);
      auVar35 = vblendvps_avx((undefined1  [16])aVar4,auVar21,auVar35);
      auVar21 = vrcpps_avx(auVar35);
      fVar34 = auVar21._0_4_;
      auVar28._0_4_ = fVar34 * auVar35._0_4_;
      fVar38 = auVar21._4_4_;
      auVar28._4_4_ = fVar38 * auVar35._4_4_;
      fVar39 = auVar21._8_4_;
      auVar28._8_4_ = fVar39 * auVar35._8_4_;
      fVar40 = auVar21._12_4_;
      auVar28._12_4_ = fVar40 * auVar35._12_4_;
      auVar41._8_4_ = 0x3f800000;
      auVar41._0_8_ = &DAT_3f8000003f800000;
      auVar41._12_4_ = 0x3f800000;
      auVar35 = vsubps_avx(auVar41,auVar28);
      auVar29._0_4_ = fVar34 + fVar34 * auVar35._0_4_;
      auVar29._4_4_ = fVar38 + fVar38 * auVar35._4_4_;
      auVar29._8_4_ = fVar39 + fVar39 * auVar35._8_4_;
      auVar29._12_4_ = fVar40 + fVar40 * auVar35._12_4_;
      uVar18 = *(undefined4 *)&(ray->org).field_0;
      auVar42._4_4_ = uVar18;
      auVar42._0_4_ = uVar18;
      auVar42._8_4_ = uVar18;
      auVar42._12_4_ = uVar18;
      uVar18 = *(undefined4 *)((long)&(ray->org).field_0 + 4);
      auVar43._4_4_ = uVar18;
      auVar43._0_4_ = uVar18;
      auVar43._8_4_ = uVar18;
      auVar43._12_4_ = uVar18;
      uVar18 = *(undefined4 *)((long)&(ray->org).field_0 + 8);
      auVar44._4_4_ = uVar18;
      auVar44._0_4_ = uVar18;
      auVar44._8_4_ = uVar18;
      auVar44._12_4_ = uVar18;
      auVar28 = vshufps_avx(auVar29,auVar29,0);
      auVar35 = vmovshdup_avx(auVar29);
      auVar41 = vshufps_avx(auVar29,auVar29,0x55);
      auVar21 = vshufpd_avx(auVar29,auVar29,1);
      auVar6 = vshufps_avx(auVar29,auVar29,0xaa);
      uVar13 = (ulong)(auVar29._0_4_ < 0.0) * 0x10;
      uVar14 = (ulong)(auVar35._0_4_ < 0.0) << 4 | 0x20;
      uVar15 = (ulong)(auVar21._0_4_ < 0.0) << 4 | 0x40;
      auVar35 = vshufps_avx(auVar5,auVar5,0);
      auVar5 = vshufps_avx(ZEXT416((uint)fVar3),ZEXT416((uint)fVar3),0);
      do {
        if (pNVar12 == stack) {
          return;
        }
        sVar16 = pNVar12[-1].ptr;
        pNVar12 = pNVar12 + -1;
        do {
          if ((sVar16 & 8) == 0) {
            uVar8 = sVar16 & 0xfffffffffffffff0;
            fVar3 = (ray->dir).field_0.m128[3];
            auVar20._4_4_ = fVar3;
            auVar20._0_4_ = fVar3;
            auVar20._8_4_ = fVar3;
            auVar20._12_4_ = fVar3;
            pfVar2 = (float *)(uVar8 + 0x80 + uVar13);
            pfVar1 = (float *)(uVar8 + 0x20 + uVar13);
            auVar22._0_4_ = fVar3 * *pfVar2 + *pfVar1;
            auVar22._4_4_ = fVar3 * pfVar2[1] + pfVar1[1];
            auVar22._8_4_ = fVar3 * pfVar2[2] + pfVar1[2];
            auVar22._12_4_ = fVar3 * pfVar2[3] + pfVar1[3];
            auVar21 = vsubps_avx(auVar22,auVar42);
            auVar23._0_4_ = auVar28._0_4_ * auVar21._0_4_;
            auVar23._4_4_ = auVar28._4_4_ * auVar21._4_4_;
            auVar23._8_4_ = auVar28._8_4_ * auVar21._8_4_;
            auVar23._12_4_ = auVar28._12_4_ * auVar21._12_4_;
            auVar21 = vmaxps_avx(auVar35,auVar23);
            pfVar2 = (float *)(uVar8 + 0x80 + uVar14);
            pfVar1 = (float *)(uVar8 + 0x20 + uVar14);
            auVar24._0_4_ = fVar3 * *pfVar2 + *pfVar1;
            auVar24._4_4_ = fVar3 * pfVar2[1] + pfVar1[1];
            auVar24._8_4_ = fVar3 * pfVar2[2] + pfVar1[2];
            auVar24._12_4_ = fVar3 * pfVar2[3] + pfVar1[3];
            auVar29 = vsubps_avx(auVar24,auVar43);
            auVar25._0_4_ = auVar41._0_4_ * auVar29._0_4_;
            auVar25._4_4_ = auVar41._4_4_ * auVar29._4_4_;
            auVar25._8_4_ = auVar41._8_4_ * auVar29._8_4_;
            auVar25._12_4_ = auVar41._12_4_ * auVar29._12_4_;
            pfVar2 = (float *)(uVar8 + 0x80 + uVar15);
            pfVar1 = (float *)(uVar8 + 0x20 + uVar15);
            auVar30._0_4_ = fVar3 * *pfVar2 + *pfVar1;
            auVar30._4_4_ = fVar3 * pfVar2[1] + pfVar1[1];
            auVar30._8_4_ = fVar3 * pfVar2[2] + pfVar1[2];
            auVar30._12_4_ = fVar3 * pfVar2[3] + pfVar1[3];
            auVar29 = vsubps_avx(auVar30,auVar44);
            auVar31._0_4_ = auVar6._0_4_ * auVar29._0_4_;
            auVar31._4_4_ = auVar6._4_4_ * auVar29._4_4_;
            auVar31._8_4_ = auVar6._8_4_ * auVar29._8_4_;
            auVar31._12_4_ = auVar6._12_4_ * auVar29._12_4_;
            auVar29 = vmaxps_avx(auVar25,auVar31);
            auVar21 = vmaxps_avx(auVar21,auVar29);
            pfVar2 = (float *)(uVar8 + 0x80 + (uVar13 ^ 0x10));
            pfVar1 = (float *)(uVar8 + 0x20 + (uVar13 ^ 0x10));
            auVar26._0_4_ = fVar3 * *pfVar2 + *pfVar1;
            auVar26._4_4_ = fVar3 * pfVar2[1] + pfVar1[1];
            auVar26._8_4_ = fVar3 * pfVar2[2] + pfVar1[2];
            auVar26._12_4_ = fVar3 * pfVar2[3] + pfVar1[3];
            auVar29 = vsubps_avx(auVar26,auVar42);
            auVar27._0_4_ = auVar28._0_4_ * auVar29._0_4_;
            auVar27._4_4_ = auVar28._4_4_ * auVar29._4_4_;
            auVar27._8_4_ = auVar28._8_4_ * auVar29._8_4_;
            auVar27._12_4_ = auVar28._12_4_ * auVar29._12_4_;
            pfVar2 = (float *)(uVar8 + 0x80 + (uVar14 ^ 0x10));
            auVar29 = vminps_avx(auVar5,auVar27);
            pfVar1 = (float *)(uVar8 + 0x20 + (uVar14 ^ 0x10));
            auVar32._0_4_ = fVar3 * *pfVar2 + *pfVar1;
            auVar32._4_4_ = fVar3 * pfVar2[1] + pfVar1[1];
            auVar32._8_4_ = fVar3 * pfVar2[2] + pfVar1[2];
            auVar32._12_4_ = fVar3 * pfVar2[3] + pfVar1[3];
            auVar22 = vsubps_avx(auVar32,auVar43);
            pfVar2 = (float *)(uVar8 + 0x80 + (uVar15 ^ 0x10));
            pfVar1 = (float *)(uVar8 + 0x20 + (uVar15 ^ 0x10));
            auVar36._0_4_ = fVar3 * *pfVar2 + *pfVar1;
            auVar36._4_4_ = fVar3 * pfVar2[1] + pfVar1[1];
            auVar36._8_4_ = fVar3 * pfVar2[2] + pfVar1[2];
            auVar36._12_4_ = fVar3 * pfVar2[3] + pfVar1[3];
            auVar33._0_4_ = auVar41._0_4_ * auVar22._0_4_;
            auVar33._4_4_ = auVar41._4_4_ * auVar22._4_4_;
            auVar33._8_4_ = auVar41._8_4_ * auVar22._8_4_;
            auVar33._12_4_ = auVar41._12_4_ * auVar22._12_4_;
            auVar22 = vsubps_avx(auVar36,auVar44);
            auVar37._0_4_ = auVar6._0_4_ * auVar22._0_4_;
            auVar37._4_4_ = auVar6._4_4_ * auVar22._4_4_;
            auVar37._8_4_ = auVar6._8_4_ * auVar22._8_4_;
            auVar37._12_4_ = auVar6._12_4_ * auVar22._12_4_;
            auVar22 = vminps_avx(auVar33,auVar37);
            auVar29 = vminps_avx(auVar29,auVar22);
            if (((uint)sVar16 & 7) == 6) {
              auVar29 = vcmpps_avx(auVar21,auVar29,2);
              auVar21 = vcmpps_avx(*(undefined1 (*) [16])(uVar8 + 0xe0),auVar20,2);
              auVar22 = vcmpps_avx(auVar20,*(undefined1 (*) [16])(uVar8 + 0xf0),1);
              auVar21 = vandps_avx(auVar21,auVar22);
              auVar21 = vandps_avx(auVar21,auVar29);
            }
            else {
              auVar21 = vcmpps_avx(auVar21,auVar29,2);
            }
            auVar21 = vpslld_avx(auVar21,0x1f);
            uVar18 = vmovmskps_avx(auVar21);
            unaff_R14 = CONCAT44((int)(unaff_R14 >> 0x20),uVar18);
          }
          if ((sVar16 & 8) == 0) {
            if (unaff_R14 == 0) {
              iVar17 = 4;
            }
            else {
              uVar8 = sVar16 & 0xfffffffffffffff0;
              lVar10 = 0;
              if (unaff_R14 != 0) {
                for (; (unaff_R14 >> lVar10 & 1) == 0; lVar10 = lVar10 + 1) {
                }
              }
              iVar17 = 0;
              sVar16 = *(size_t *)(uVar8 + lVar10 * 8);
              uVar11 = unaff_R14 - 1 & unaff_R14;
              if (uVar11 != 0) {
                pNVar12->ptr = sVar16;
                lVar10 = 0;
                if (uVar11 != 0) {
                  for (; (uVar11 >> lVar10 & 1) == 0; lVar10 = lVar10 + 1) {
                  }
                }
                uVar9 = uVar11 - 1;
                while( true ) {
                  pNVar12 = pNVar12 + 1;
                  sVar16 = *(size_t *)(uVar8 + lVar10 * 8);
                  uVar9 = uVar9 & uVar11;
                  if (uVar9 == 0) break;
                  pNVar12->ptr = sVar16;
                  lVar10 = 0;
                  if (uVar9 != 0) {
                    for (; (uVar9 >> lVar10 & 1) == 0; lVar10 = lVar10 + 1) {
                    }
                  }
                  uVar11 = uVar9 - 1;
                }
              }
            }
          }
          else {
            iVar17 = 6;
          }
        } while (iVar17 == 0);
        if (iVar17 == 6) {
          uVar8 = (ulong)((uint)sVar16 & 0xf);
          iVar17 = 0;
          bVar19 = uVar8 != 8;
          if (bVar19) {
            prim = (InstancePrimitive *)(sVar16 & 0xfffffffffffffff0);
            bVar7 = InstanceIntersector1MB::occluded(&pre,ray,context,prim);
            if (!bVar7) {
              uVar11 = 0;
              do {
                prim = prim + 1;
                if (uVar8 - 9 == uVar11) goto LAB_002e3b45;
                bVar19 = InstanceIntersector1MB::occluded(&pre,ray,context,prim);
                uVar11 = uVar11 + 1;
              } while (!bVar19);
              bVar19 = uVar11 < uVar8 - 8;
            }
            iVar17 = 0;
            if (bVar19) {
              ray->tfar = -INFINITY;
              iVar17 = 3;
            }
          }
        }
LAB_002e3b45:
      } while (iVar17 != 3);
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::occluded(const Accel::Intersectors* __restrict__ This,
                                                                             Ray& __restrict__ ray,
                                                                             RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
       
      /* early out for already occluded rays */
      if (unlikely(ray.tfar < 0.0f))
        return;

      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      NodeRef stack[stackSize];    // stack of nodes that still need to get traversed
      NodeRef* stackPtr = stack+1; // current stack pointer
      NodeRef* stackEnd = stack+stackSize;
      stack[0] = bvh->root;

      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif

      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = (NodeRef)*stackPtr;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(shadow.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(shadow.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        if (PrimitiveIntersector1::occluded(This, pre, ray, context, prim, num, tray, lazy_node)) {
          ray.tfar = neg_inf;
          break;
        }

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          *stackPtr = (NodeRef)lazy_node;
          stackPtr++;
        }
      }
    }